

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

int ZSTD_disableLiteralsCompression(ZSTD_CCtx_params *cctxParams)

{
  uint uVar1;
  
  uVar1 = 0;
  if (cctxParams->literalCompressionMode != ZSTD_lcm_huffman) {
    if (cctxParams->literalCompressionMode == ZSTD_lcm_uncompressed) {
      return 1;
    }
    if ((cctxParams->cParams).strategy == ZSTD_fast) {
      uVar1 = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  return uVar1;
}

Assistant:

MEM_STATIC int ZSTD_disableLiteralsCompression(const ZSTD_CCtx_params* cctxParams)
{
    switch (cctxParams->literalCompressionMode) {
    case ZSTD_lcm_huffman:
        return 0;
    case ZSTD_lcm_uncompressed:
        return 1;
    default:
        assert(0 /* impossible: pre-validated */);
        /* fall-through */
    case ZSTD_lcm_auto:
        return (cctxParams->cParams.strategy == ZSTD_fast) && (cctxParams->cParams.targetLength > 0);
    }
}